

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O2

ssize_t __thiscall Flasher::write(Flasher *this,int __fd,void *__buf,size_t __n)

{
  Flash *pFVar1;
  FlasherObserver *pFVar2;
  _func_int *p_Var3;
  undefined1 *puVar4;
  size_t __n_00;
  uint uVar5;
  int iVar6;
  FILE *__stream;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  undefined4 extraout_var;
  int *piVar10;
  undefined8 *puVar11;
  undefined4 in_register_00000034;
  ulong uVar12;
  pointer_____offset_0x10___ *ppuVar13;
  undefined1 auStack_1068 [4088];
  undefined1 *puStack_70;
  undefined1 auStack_68 [8];
  long local_60;
  undefined1 *local_58;
  ulong local_50;
  ulong local_48;
  size_t local_40;
  uint local_34;
  
  uVar12 = (ulong)__buf & 0xffffffff;
  puStack_70 = (undefined1 *)0x1094db;
  local_34 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[3])();
  local_48 = uVar12 / local_34;
  if ((int)(uVar12 % (ulong)local_34) != 0) {
LAB_00109726:
    puStack_70 = (undefined1 *)0x10972e;
    puVar11 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar11 = &PTR__exception_00117388;
    puStack_70 = (undefined1 *)0x10974e;
    __cxa_throw(puVar11,&FlashOffsetError::typeinfo,std::exception::~exception);
  }
  puStack_70 = (undefined1 *)0x109500;
  uVar5 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[6])();
  if (uVar5 <= (uint)__buf) goto LAB_00109726;
  puStack_70 = (undefined1 *)0x109518;
  __stream = fopen((char *)CONCAT44(in_register_00000034,__fd),"rb");
  if (__stream == (FILE *)0x0) {
    puStack_70 = (undefined1 *)0x10977e;
    puVar11 = (undefined8 *)__cxa_allocate_exception(0x10);
    puStack_70 = (undefined1 *)0x109786;
    piVar10 = __errno_location();
    iVar6 = *piVar10;
    *puVar11 = &PTR__exception_001173b0;
    *(int *)(puVar11 + 1) = iVar6;
    puStack_70 = (undefined1 *)0x1097ab;
    __cxa_throw(puVar11,&FileOpenError::typeinfo,std::exception::~exception);
  }
  puStack_70 = (undefined1 *)0x109531;
  iVar6 = fseek(__stream,0,2);
  if (iVar6 == 0) {
    puStack_70 = (undefined1 *)0x109541;
    lVar7 = ftell(__stream);
    if (-1 < lVar7) {
      puStack_70 = (undefined1 *)0x109555;
      rewind(__stream);
      local_40 = (size_t)local_34;
      uVar8 = (long)(local_40 + lVar7 + -1) / (long)local_40;
      puStack_70 = (undefined1 *)0x109578;
      uVar5 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t
                 .super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                 super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[4])();
      if ((uint)uVar8 <= uVar5) {
        puStack_70 = (undefined1 *)0x10959b;
        (*this->_observer->_vptr_FlasherObserver[2])
                  (this->_observer,"Write %ld bytes to flash (%u pages)\n",lVar7,uVar8 & 0xffffffff)
        ;
        local_58 = auStack_68;
        local_50 = uVar8;
        if (this->_samba->_canWriteBuffer == true) {
          local_60 = local_40 - 1;
          uVar8 = 0;
          local_48 = uVar12;
          while( true ) {
            sVar9 = fread(auStack_1068,1,0x1000,__stream);
            if (sVar9 == 0) break;
            (*this->_observer->_vptr_FlasherObserver[3])(this->_observer,uVar8 / local_34,local_50);
            if (sVar9 < 0x1000) {
              memset(auStack_1068 + sVar9,0,0x1000 - sVar9);
              sVar9 = (sVar9 + local_60) - (sVar9 + local_60) % local_40;
            }
            pFVar1 = (this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                     _M_t.super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                     super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
            (*pFVar1->_vptr_Flash[0x1b])(pFVar1,auStack_1068,sVar9 & 0xffff);
            pFVar1 = (this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                     _M_t.super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                     super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
            (*pFVar1->_vptr_Flash[0x1a])
                      (pFVar1,(ulong)(uint)((int)uVar8 + (int)local_48),sVar9 & 0xffffffff);
            uVar8 = (ulong)(uint)((int)uVar8 + (int)sVar9);
          }
        }
        else {
          lVar7 = -(local_40 + 0xf & 0xfffffffffffffff0);
          local_34 = (uint)uVar8 - 1;
          uVar12 = 0;
          while( true ) {
            *(undefined8 *)(auStack_68 + lVar7 + -8) = 1;
            __n_00 = local_40;
            sVar9 = *(size_t *)(auStack_68 + lVar7 + -8);
            *(undefined8 *)(auStack_68 + lVar7 + -8) = 0x1096a4;
            sVar9 = fread(auStack_68 + lVar7,sVar9,__n_00,__stream);
            uVar8 = local_50;
            if (sVar9 == 0) break;
            pFVar2 = this->_observer;
            uVar5 = (uint)uVar12;
            p_Var3 = pFVar2->_vptr_FlasherObserver[3];
            *(undefined8 *)(auStack_68 + lVar7 + -8) = 0x1096bd;
            (*p_Var3)(pFVar2,uVar12,uVar8);
            pFVar1 = (this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                     _M_t.super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                     super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
            p_Var3 = pFVar1->_vptr_Flash[0x1b];
            *(undefined8 *)(auStack_68 + lVar7 + -8) = 0x1096d4;
            (*p_Var3)(pFVar1,auStack_68 + lVar7,sVar9 & 0xffff);
            pFVar1 = (this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                     _M_t.super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                     super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
            iVar6 = (int)local_48;
            p_Var3 = pFVar1->_vptr_Flash[0x18];
            *(undefined8 *)(auStack_68 + lVar7 + -8) = 0x1096ec;
            (*p_Var3)(pFVar1,(ulong)(uVar5 + iVar6));
            if ((local_34 == uVar5) || (uVar12 = (ulong)(uVar5 + 1), sVar9 != local_40)) break;
          }
        }
        puVar4 = local_58;
        *(undefined8 *)(local_58 + -8) = 0x109707;
        fclose(__stream);
        pFVar2 = this->_observer;
        uVar12 = local_50 & 0xffffffff;
        p_Var3 = pFVar2->_vptr_FlasherObserver[3];
        *(undefined8 *)(puVar4 + -8) = 0x109717;
        iVar6 = (*p_Var3)(pFVar2,uVar12);
        return CONCAT44(extraout_var,iVar6);
      }
      puStack_70 = (undefined1 *)0x1097b3;
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = &PTR__exception_00117400;
      ppuVar13 = &FileSizeError::typeinfo;
      goto LAB_001097c7;
    }
  }
  puStack_70 = (undefined1 *)0x109756;
  puVar11 = (undefined8 *)__cxa_allocate_exception(0x10);
  puStack_70 = (undefined1 *)0x10975e;
  piVar10 = __errno_location();
  iVar6 = *piVar10;
  *puVar11 = &PTR__exception_001173d8;
  *(int *)(puVar11 + 1) = iVar6;
  ppuVar13 = &FileIoError::typeinfo;
LAB_001097c7:
  puStack_70 = &LAB_001097d6;
  __cxa_throw(puVar11,ppuVar13,std::exception::~exception);
}

Assistant:

void
Flasher::write(const char* filename, uint32_t foffset)
{
    FILE* infile;
    uint32_t pageSize = _flash->pageSize();
    uint32_t pageNum = 0;
    uint32_t numPages;
    long fsize;
    size_t fbytes;

    if (foffset % pageSize != 0 || foffset >= _flash->totalSize())
        throw FlashOffsetError();
    
    infile = fopen(filename, "rb");
    if (!infile)
        throw FileOpenError(errno);

    try
    {
        if (fseek(infile, 0, SEEK_END) != 0 || (fsize = ftell(infile)) < 0)
            throw FileIoError(errno);
        
        rewind(infile);

        numPages = (fsize + pageSize - 1) / pageSize;
        if (numPages > _flash->numPages())
            throw FileSizeError();

        _observer.onStatus("Write %ld bytes to flash (%u pages)\n", fsize, numPages);
       
      
        if (_samba.canWriteBuffer())
        {
           
            uint32_t offset = 0;
            uint32_t bufferSize = _samba.writeBufferSize();
            uint8_t buffer[bufferSize];
            
            while ((fbytes = fread(buffer, 1, bufferSize, infile)) > 0)
            {
                _observer.onProgress(offset / pageSize, numPages);
                
                if (fbytes < bufferSize)
                {
                    memset(buffer + fbytes, 0, bufferSize - fbytes);
                    fbytes = (fbytes + pageSize - 1) / pageSize * pageSize;
                }
                
                _flash->loadBuffer(buffer, fbytes);
                _flash->writeBuffer(foffset + offset, fbytes);
                offset += fbytes;                
            }

        }
        else
        {
            uint8_t buffer[pageSize];
            uint32_t pageOffset = foffset / pageSize;

            while ((fbytes = fread(buffer, 1, pageSize, infile)) > 0)
            {
                _observer.onProgress(pageNum, numPages);

                _flash->loadBuffer(buffer, fbytes);
                _flash->writePage(pageOffset + pageNum);

                pageNum++;
                if (pageNum == numPages || fbytes != pageSize)
                    break;
            }

        }
    }
    catch(...)
    {
        fclose(infile);
        throw;
    }
    
    fclose(infile);
    _observer.onProgress(numPages, numPages);
}